

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Loop *pLVar3;
  undefined4 extraout_var_00;
  pointer pSVar4;
  reference ppSVar5;
  SENode *node_00;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_a0;
  SENode *local_98;
  SENode *child;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *__range2_1;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> add_node;
  SENode *local_68;
  SENode *itr;
  iterator __end2;
  iterator __begin2;
  SENode *__range2;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> new_children;
  SERecurrentNode *recurrent;
  Loop *loop_local;
  SENode *node_local;
  ScalarEvolutionAnalysis *this_local;
  
  iVar2 = (*node->_vptr_SENode[6])();
  new_children.super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  if ((SERecurrentNode *)
      new_children.
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == (SERecurrentNode *)0x0) {
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::vector
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               &__range2);
    __end2 = SENode::begin(node);
    itr = (SENode *)SENode::end(node);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                       *)&itr), bVar1) {
      ppSVar5 = __gnu_cxx::
                __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                ::operator*(&__end2);
      local_68 = *ppSVar5;
      iVar2 = (*local_68->_vptr_SENode[6])();
      new_children.
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_00,iVar2);
      if (((SERecurrentNode *)
           new_children.
           super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (SERecurrentNode *)0x0) ||
         (pLVar3 = SERecurrentNode::GetLoop
                             ((SERecurrentNode *)
                              new_children.
                              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), pLVar3 != loop))
      {
        std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::push_back
                  ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                   &__range2,&local_68);
      }
      else {
        add_node._M_t.
        super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>.
        _M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
             (__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
              )SERecurrentNode::GetOffset
                         ((SERecurrentNode *)
                          new_children.
                          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::push_back
                  ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                   &__range2,(value_type *)&add_node);
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
      ::operator++(&__end2);
    }
    pSVar4 = (pointer)::operator_new(0x30);
    SEAddNode::SEAddNode((SEAddNode *)pSVar4,this);
    std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
    unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
              ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
               &__range2_1,pSVar4);
    __end2_1 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::begin
                         ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                           *)&__range2);
    child = (SENode *)
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                      ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                       &__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                               *)&child), bVar1) {
      ppSVar5 = __gnu_cxx::
                __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                ::operator*(&__end2_1);
      local_98 = *ppSVar5;
      pSVar4 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
               operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                           *)&__range2_1);
      (*pSVar4->_vptr_SENode[3])(pSVar4,local_98);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
      ::operator++(&__end2_1);
    }
    std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::unique_ptr
              (&local_a0,
               (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *)
               &__range2_1);
    node_00 = GetCachedOrAdd(this,&local_a0);
    this_local = (ScalarEvolutionAnalysis *)SimplifyExpression(this,node_00);
    std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
              (&local_a0);
    std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
              ((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *)
               &__range2_1);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::~vector
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               &__range2);
  }
  else {
    pLVar3 = SERecurrentNode::GetLoop
                       ((SERecurrentNode *)
                        new_children.
                        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (ScalarEvolutionAnalysis *)node;
    if (pLVar3 == loop) {
      this_local = (ScalarEvolutionAnalysis *)
                   SERecurrentNode::GetOffset
                             ((SERecurrentNode *)
                              new_children.
                              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return (SENode *)this_local;
}

Assistant:

SENode* ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm(
    SENode* node, const Loop* loop) {
  // If the node is already a recurrent expression belonging to loop then just
  // return the offset.
  SERecurrentNode* recurrent = node->AsSERecurrentNode();
  if (recurrent) {
    if (recurrent->GetLoop() == loop) {
      return recurrent->GetOffset();
    } else {
      return node;
    }
  }

  std::vector<SENode*> new_children;
  // Otherwise find the recurrent node in the children of this node.
  for (auto itr : *node) {
    recurrent = itr->AsSERecurrentNode();
    if (recurrent && recurrent->GetLoop() == loop) {
      new_children.push_back(recurrent->GetOffset());
    } else {
      new_children.push_back(itr);
    }
  }

  std::unique_ptr<SENode> add_node{new SEAddNode(this)};
  for (SENode* child : new_children) {
    add_node->AddChild(child);
  }

  return SimplifyExpression(GetCachedOrAdd(std::move(add_node)));
}